

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# priority_list.cpp
# Opt level: O3

void print_current(ostream *os,Am_Priority_List_Item *current)

{
  ostream *poVar1;
  
  std::__ostream_insert<char,std::char_traits<char>>(os,"(",1);
  poVar1 = std::ostream::_M_insert<double>((double)current->main_priority);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,",",1);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,current->second_priority);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,",",1);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,current->third_priority);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,")",1);
  poVar1 = operator<<(poVar1,&current->obj);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
  return;
}

Assistant:

void
print_current(std::ostream &os, Am_Priority_List_Item *current)
{
  os << "(" << current->main_priority << "," << current->second_priority << ","
     << current->third_priority << ")" << current->obj << " ";
}